

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
cnn::SparsemaxLoss::dim_forward
          (Dim *__return_storage_ptr__,SparsemaxLoss *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  ulong uVar1;
  pointer pDVar2;
  long lVar3;
  invalid_argument *this_00;
  ulong uVar4;
  ulong uVar5;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar2 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar2 == 0x24) {
    uVar4 = (ulong)pDVar2->nd;
    if (uVar4 < 2) {
LAB_00206081:
      __return_storage_ptr__->nd = 1;
      __return_storage_ptr__->bd = 1;
      __return_storage_ptr__->d[0] = 1;
      return __return_storage_ptr__;
    }
    if (pDVar2->d[1] == 1) {
      uVar5 = 1;
      do {
        if ((2 - uVar4) + uVar5 == 1) goto LAB_00206081;
        uVar1 = uVar5 + 1;
        lVar3 = uVar5 + 1;
        uVar5 = uVar1;
      } while (pDVar2->d[lVar3] == 1);
      if (uVar4 <= uVar1) goto LAB_00206081;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"Bad input dimensions in SparsemaxLoss: ",0x27);
  operator<<((ostream *)local_190,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1b0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SparsemaxLoss::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || !LooksLikeVector(xs[0])) {
    ostringstream s; s << "Bad input dimensions in SparsemaxLoss: " << xs;
    throw std::invalid_argument(s.str());
  }
  return Dim({1});
}